

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O1

Bool tidyOptSetInt(TidyDoc tdoc,TidyOptionId optId,ulong val)

{
  TidyOptionId optId_00;
  Bool BVar1;
  
  if (tdoc != (TidyDoc)0x0) {
    optId_00 = TidyDoctypeMode;
    if (optId != TidyDoctype) {
      optId_00 = optId;
    }
    BVar1 = prvTidySetOptionInt((TidyDocImpl *)tdoc,optId_00,val);
    return BVar1;
  }
  return no;
}

Assistant:

Bool TIDY_CALL        tidyOptSetInt( TidyDoc tdoc, TidyOptionId optId, ulong val )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    if ( impl )
    {
        /* Special case for TidyDoctype, because it has a picklist */
        if ( optId == TidyDoctype )
            return TY_(SetOptionInt)( impl, TidyDoctypeMode, val );
        else
            return TY_(SetOptionInt)( impl, optId, val );
    }
    return no;
}